

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
emplace_back<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *this,ProdItem *args)

{
  undefined8 *puVar1;
  size_type sVar2;
  ulong uVar3;
  RandSeqProductionSymbol *pRVar4;
  size_t sVar5;
  undefined8 uVar6;
  ProdBase PVar7;
  undefined4 uVar8;
  pointer pPVar9;
  pointer pPVar10;
  pointer pPVar11;
  pointer pPVar12;
  EVP_PKEY_CTX *pEVar13;
  EVP_PKEY_CTX *ctx;
  long lVar14;
  pointer pPVar15;
  
  pPVar15 = this->data_ + this->len;
  if (this->len != this->cap) {
    PVar7.kind = (args->super_ProdBase).kind;
    uVar8 = *(undefined4 *)&args->field_0x4;
    pRVar4 = args->target;
    sVar5 = (args->args)._M_extent._M_extent_value;
    (pPVar15->args)._M_ptr = (args->args)._M_ptr;
    (pPVar15->args)._M_extent._M_extent_value = sVar5;
    pPVar15->super_ProdBase = (ProdBase)PVar7.kind;
    *(undefined4 *)&pPVar15->field_0x4 = uVar8;
    pPVar15->target = pRVar4;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return this->data_ + sVar2;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar13 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar13 < ctx) {
    pEVar13 = ctx;
  }
  if (0x3ffffffffffffff - uVar3 < uVar3) {
    pEVar13 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar14 = (long)pPVar15 - (long)this->data_;
  pPVar9 = (pointer)operator_new((long)pEVar13 << 5);
  uVar6 = *(undefined8 *)args;
  pRVar4 = args->target;
  sVar5 = (args->args)._M_extent._M_extent_value;
  puVar1 = (undefined8 *)((long)pPVar9 + lVar14 + 0x10);
  *puVar1 = (args->args)._M_ptr;
  puVar1[1] = sVar5;
  *(undefined8 *)((long)pPVar9 + lVar14) = uVar6;
  ((undefined8 *)((long)pPVar9 + lVar14))[1] = pRVar4;
  pPVar12 = this->data_;
  pPVar10 = pPVar12 + this->len;
  pPVar11 = pPVar9;
  if (pPVar10 == pPVar15) {
    for (; pPVar12 != pPVar15; pPVar12 = pPVar12 + 1) {
      PVar7.kind = (pPVar12->super_ProdBase).kind;
      uVar8 = *(undefined4 *)&pPVar12->field_0x4;
      pRVar4 = pPVar12->target;
      sVar5 = (pPVar12->args)._M_extent._M_extent_value;
      (pPVar11->args)._M_ptr = (pPVar12->args)._M_ptr;
      (pPVar11->args)._M_extent._M_extent_value = sVar5;
      pPVar11->super_ProdBase = (ProdBase)PVar7.kind;
      *(undefined4 *)&pPVar11->field_0x4 = uVar8;
      pPVar11->target = pRVar4;
      pPVar11 = pPVar11 + 1;
    }
  }
  else {
    for (; pPVar12 != pPVar15; pPVar12 = pPVar12 + 1) {
      PVar7.kind = (pPVar12->super_ProdBase).kind;
      uVar8 = *(undefined4 *)&pPVar12->field_0x4;
      pRVar4 = pPVar12->target;
      sVar5 = (pPVar12->args)._M_extent._M_extent_value;
      (pPVar11->args)._M_ptr = (pPVar12->args)._M_ptr;
      (pPVar11->args)._M_extent._M_extent_value = sVar5;
      pPVar11->super_ProdBase = (ProdBase)PVar7.kind;
      *(undefined4 *)&pPVar11->field_0x4 = uVar8;
      pPVar11->target = pRVar4;
      pPVar11 = pPVar11 + 1;
    }
    puVar1 = (undefined8 *)(lVar14 + (long)pPVar9);
    for (; pPVar15 != pPVar10; pPVar15 = pPVar15 + 1) {
      uVar6 = *(undefined8 *)pPVar15;
      pRVar4 = pPVar15->target;
      sVar5 = (pPVar15->args)._M_extent._M_extent_value;
      puVar1[6] = (pPVar15->args)._M_ptr;
      puVar1[7] = sVar5;
      puVar1[4] = uVar6;
      puVar1[5] = pRVar4;
      puVar1 = puVar1 + 4;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar13;
  this->data_ = pPVar9;
  return (reference)((long)pPVar9 + lVar14);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }